

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# with_presence.cc
# Opt level: O0

void google::protobuf::compiler::rust::WithPresenceAccessorsInMsgImpl
               (Context *ctx,FieldDescriptor *field,AccessorCase accessor_case)

{
  initializer_list<google::protobuf::io::Printer::Sub> v;
  undefined8 ctx_00;
  FieldDescriptor *pFVar1;
  FieldDescriptor *this;
  byte bVar2;
  LogMessage *pLVar3;
  char *in_RCX;
  FieldDescriptor *field_00;
  char *in_R9;
  string_view name;
  string_view lifetime;
  Sub *local_840;
  basic_string_view<char,_std::char_traits<char>_> local_780;
  undefined1 local_769;
  anon_class_16_2_0fb76c96_for_cb local_768;
  allocator<char> local_751;
  string local_750;
  anon_class_24_3_7bddebb2_for_cb local_730;
  allocator<char> local_711;
  string local_710;
  anon_class_16_2_d8a4dd5c_for_cb local_6f0;
  allocator<char> local_6d9;
  string local_6d8;
  string_view local_6b8;
  allocator<char> local_6a1;
  string local_6a0;
  string_view local_680;
  string local_670;
  allocator<char> local_649;
  string local_648;
  allocator<char> local_621;
  string local_620;
  undefined1 local_600 [16];
  string local_5f0;
  allocator<char> local_5c9;
  string local_5c8;
  Sub *local_5a8;
  Sub local_5a0;
  Sub local_4e8;
  Sub local_430;
  Sub local_378;
  Sub local_2c0;
  Sub local_208;
  Sub local_150;
  iterator local_98;
  size_type local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_88;
  undefined1 local_78 [8];
  string field_name;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_40;
  LogMessageFatal local_30 [19];
  Voidify local_1d;
  AccessorCase local_1c [2];
  AccessorCase accessor_case_local;
  FieldDescriptor *field_local;
  Context *ctx_local;
  
  local_1c[0] = accessor_case;
  unique0x1000070d = field;
  field_local = (FieldDescriptor *)ctx;
  bVar2 = google::protobuf::FieldDescriptor::has_presence();
  if (((bVar2 ^ 0xff) & 1) == 0) {
    FieldNameWithCollisionAvoidance_abi_cxx11_
              ((string *)local_78,(rust *)stack0xffffffffffffffe8,field_00);
    pFVar1 = field_local;
    local_769 = 1;
    local_5a8 = &local_5a0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_5c8,"field",&local_5c9);
    local_600 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_78);
    name._M_len = local_600._8_8_;
    name._M_str = in_RCX;
    RsSafeName_abi_cxx11_(&local_5f0,local_600._0_8_,name);
    io::Printer::Sub::Sub<std::__cxx11::string>(&local_5a0,&local_5c8,&local_5f0);
    local_5a8 = &local_4e8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_620,"raw_field_name",&local_621);
    io::Printer::Sub::Sub<std::__cxx11::string&>
              (&local_4e8,&local_620,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78);
    local_5a8 = &local_430;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_648,"view_type",&local_649);
    this = field_local;
    ctx_00 = stack0xffffffffffffffe8;
    local_680 = ViewLifetime(local_1c[0]);
    lifetime._M_str = in_R9;
    lifetime._M_len = (size_t)local_680._M_str;
    RsViewType_abi_cxx11_
              (&local_670,(rust *)this,(Context *)ctx_00,(FieldDescriptor *)local_680._M_len,
               lifetime);
    io::Printer::Sub::Sub<std::__cxx11::string>(&local_430,&local_648,&local_670);
    local_5a8 = &local_378;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_6a0,"view_self",&local_6a1);
    local_6b8 = ViewReceiver(local_1c[0]);
    io::Printer::Sub::Sub<std::basic_string_view<char,std::char_traits<char>>>
              (&local_378,&local_6a0,&local_6b8);
    local_5a8 = &local_2c0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_6d8,"hazzer",&local_6d9);
    local_6f0.ctx = (Context *)field_local;
    local_6f0.field = (FieldDescriptor *)stack0xffffffffffffffe8;
    io::Printer::Sub::
    Sub<google::protobuf::compiler::rust::WithPresenceAccessorsInMsgImpl(google::protobuf::compiler::rust::Context&,google::protobuf::FieldDescriptor_const&,google::protobuf::compiler::rust::AccessorCase)::__0>
              (&local_2c0,&local_6d8,&local_6f0);
    local_5a8 = &local_208;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_710,"clearer",&local_711);
    local_730.accessor_case = local_1c;
    local_730.ctx = (Context *)field_local;
    local_730.field = (FieldDescriptor *)stack0xffffffffffffffe8;
    io::Printer::Sub::
    Sub<google::protobuf::compiler::rust::WithPresenceAccessorsInMsgImpl(google::protobuf::compiler::rust::Context&,google::protobuf::FieldDescriptor_const&,google::protobuf::compiler::rust::AccessorCase)::__1>
              (&local_208,&local_710,&local_730);
    local_5a8 = &local_150;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_750,"opt_getter",&local_751)
    ;
    local_768.field = (FieldDescriptor *)stack0xffffffffffffffe8;
    local_768.ctx = (Context *)field_local;
    io::Printer::Sub::
    Sub<google::protobuf::compiler::rust::WithPresenceAccessorsInMsgImpl(google::protobuf::compiler::rust::Context&,google::protobuf::FieldDescriptor_const&,google::protobuf::compiler::rust::AccessorCase)::__2>
              (&local_150,&local_750,&local_768);
    local_769 = 0;
    local_98 = &local_5a0;
    local_90 = 7;
    v._M_len = 7;
    v._M_array = local_98;
    absl::lts_20240722::Span<google::protobuf::io::Printer::Sub_const>::
    Span<google::protobuf::io::Printer::Sub_const,google::protobuf::io::Printer::Sub_const>
              ((Span<google::protobuf::io::Printer::Sub_const> *)local_88._M_local_buf,v);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_780,"\n    $hazzer$\n    $clearer$\n    $opt_getter$\n    ");
    io::Printer::SourceLocation::current();
    Context::Emit((Context *)pFVar1,local_88._M_allocated_capacity,local_88._8_8_,local_780._M_len,
                  local_780._M_str);
    local_840 = (Sub *)&local_98;
    do {
      local_840 = local_840 + -1;
      io::Printer::Sub::~Sub(local_840);
    } while (local_840 != &local_5a0);
    std::__cxx11::string::~string((string *)&local_750);
    std::allocator<char>::~allocator(&local_751);
    std::__cxx11::string::~string((string *)&local_710);
    std::allocator<char>::~allocator(&local_711);
    std::__cxx11::string::~string((string *)&local_6d8);
    std::allocator<char>::~allocator(&local_6d9);
    std::__cxx11::string::~string((string *)&local_6a0);
    std::allocator<char>::~allocator(&local_6a1);
    std::__cxx11::string::~string((string *)&local_670);
    std::__cxx11::string::~string((string *)&local_648);
    std::allocator<char>::~allocator(&local_649);
    std::__cxx11::string::~string((string *)&local_620);
    std::allocator<char>::~allocator(&local_621);
    std::__cxx11::string::~string((string *)&local_5f0);
    std::__cxx11::string::~string((string *)&local_5c8);
    std::allocator<char>::~allocator(&local_5c9);
    std::__cxx11::string::~string((string *)local_78);
    return;
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&local_40,"field.has_presence()");
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            (local_30,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/compiler/rust/accessors/with_presence.cc"
             ,0x1b,local_40._M_allocated_capacity,local_40._8_8_);
  pLVar3 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_30);
  absl::lts_20240722::log_internal::Voidify::operator&&(&local_1d,pLVar3);
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_30);
}

Assistant:

void WithPresenceAccessorsInMsgImpl(Context& ctx, const FieldDescriptor& field,
                                    AccessorCase accessor_case) {
  ABSL_CHECK(field.has_presence());

  std::string field_name = FieldNameWithCollisionAvoidance(field);

  ctx.Emit(
      {{"field", RsSafeName(field_name)},
       {"raw_field_name", field_name},  // Never r# prefixed
       {"view_type", RsViewType(ctx, field, ViewLifetime(accessor_case))},
       {"view_self", ViewReceiver(accessor_case)},
       {"hazzer",
        [&] {
          if (ctx.is_cpp()) {
            ctx.Emit({{"hazzer_thunk", ThunkName(ctx, field, "has")}},
                     R"rs(
                  pub fn has_$raw_field_name$($view_self$) -> bool {
                    unsafe {
                      $hazzer_thunk$(self.raw_msg())
                    }
                  }
                  )rs");
          } else {
            ctx.Emit({{"upb_mt_field_index", UpbMiniTableFieldIndex(field)}},
                     R"rs(
                  pub fn has_$raw_field_name$($view_self$) -> bool {
                    unsafe {
                      let f = $pbr$::upb_MiniTable_GetFieldByIndex(
                          <Self as $pbr$::AssociatedMiniTable>::mini_table(),
                          $upb_mt_field_index$);
                      $pbr$::upb_Message_HasBaseField(self.raw_msg(), f)
                    }
                  }
                  )rs");
          }
        }},
       {"clearer",
        [&] {
          if (accessor_case == AccessorCase::VIEW) return;
          if (ctx.is_cpp()) {
            ctx.Emit({{"clearer_thunk", ThunkName(ctx, field, "clear")}},
                     R"rs(
                    pub fn clear_$raw_field_name$(&mut self) {
                      unsafe { $clearer_thunk$(self.raw_msg()) }
                    })rs");
          } else {
            ctx.Emit({{"upb_mt_field_index", UpbMiniTableFieldIndex(field)}},
                     R"rs(
                    pub fn clear_$raw_field_name$(&mut self) {
                      unsafe {
                        let mt = <Self as $pbr$::AssociatedMiniTable>::mini_table();
                        let f = $pbr$::upb_MiniTable_GetFieldByIndex(
                            mt, $upb_mt_field_index$);
                        $pbr$::upb_Message_ClearBaseField(self.raw_msg(), f);
                      }
                    })rs");
          }
        }},
       {"opt_getter",
        [&] {
          // Cord fields don't support the _opt getter.
          if (field.options().ctype() == FieldOptions::CORD) return;
          ctx.Emit(
              R"rs(
              pub fn $raw_field_name$_opt($view_self$) -> $pb$::Optional<$view_type$> {
                    $pb$::Optional::new(self.$field$(), self.has_$raw_field_name$())
              }
              )rs");
        }}},
      R"rs(
    $hazzer$
    $clearer$
    $opt_getter$
    )rs");
}